

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O2

void deqp::gles2::Functional::createCaseGroup
               (TestCaseGroup *parent,char *groupName,char *groupDesc,TexFuncCaseSpec *cases,
               int numCases,bool isVertex)

{
  size_type *evaluator;
  Context *pCVar1;
  char *name;
  undefined8 uVar2;
  TestNode *node;
  ShaderRenderCase *this;
  long lVar3;
  long lVar4;
  undefined4 *puVar5;
  string *psVar6;
  byte bVar7;
  
  bVar7 = 0;
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,(parent->super_TestCaseGroup).super_TestNode.m_testCtx,groupName,
             groupDesc);
  tcu::TestNode::addChild((TestNode *)parent,node);
  for (lVar4 = 0; lVar4 != 0x4c0; lVar4 = lVar4 + 0x98) {
    this = (ShaderRenderCase *)operator_new(0x200);
    pCVar1 = parent->m_context;
    name = *(char **)((long)(cases->lookupSpec).minCoord.m_data + lVar4 + -0xc);
    uVar2 = *(undefined8 *)((long)&cases->evalFunc + lVar4);
    (this->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ShaderTextureFunctionCase_0071a2e8;
    evaluator = &this[1].m_vertShaderSource._M_string_length;
    deqp::gls::ShaderRenderCase::ShaderRenderCase
              (this,pCVar1->m_testCtx,pCVar1->m_renderCtx,pCVar1->m_contextInfo,name,"",
               SUB41(numCases,0),(ShaderEvaluator *)evaluator);
    (this->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ShaderTextureFunctionCase_0071a2e8;
    *(undefined4 *)&this[1].super_TestCase.super_TestNode._vptr_TestNode =
         *(undefined4 *)((long)(cases->lookupSpec).minCoord.m_data + lVar4 + -4);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)((long)&this[1].super_TestCase.super_TestNode._vptr_TestNode + 4)
               ,(Vector<float,_4> *)((long)(cases->lookupSpec).minCoord.m_data + lVar4));
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)
               ((long)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4),
               (Vector<float,_4> *)((long)(cases->lookupSpec).maxCoord.m_data + lVar4));
    *(undefined4 *)((long)&this[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
         *(undefined4 *)((long)(&(cases->lookupSpec).maxCoord + 1) + lVar4 + 8);
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
         *(undefined8 *)((long)(&(cases->lookupSpec).maxCoord + 1) + lVar4);
    puVar5 = (undefined4 *)((long)&((TextureSpec *)(&cases->lookupSpec + 1))->type + lVar4);
    psVar6 = &this[1].super_TestCase.super_TestNode.m_description;
    for (lVar3 = 0x15; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined4 *)&(psVar6->_M_dataplus)._M_p = *puVar5;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      psVar6 = (string *)((long)psVar6 + (ulong)bVar7 * -8 + 4);
    }
    *(undefined4 *)&this[1].field_0x84 = 0;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&this[1].m_defaultEvaluator,1.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&this[1].m_evaluator,0.0);
    deqp::gls::ShaderEvaluator::ShaderEvaluator((ShaderEvaluator *)evaluator);
    this[1].m_vertShaderSource._M_string_length = (size_type)&PTR__ShaderEvaluator_0071a3a0;
    *(undefined8 *)((long)&this[1].m_vertShaderSource.field_2 + 8) = uVar2;
    this[1].m_fragShaderSource._M_dataplus._M_p = &this[1].field_0x84;
    this[1].m_fragShaderSource._M_string_length = 0;
    this[1].m_fragShaderSource.field_2._M_allocated_capacity = 0;
    tcu::TestNode::addChild(node,(TestNode *)this);
  }
  return;
}

Assistant:

static void createCaseGroup (TestCaseGroup* parent, const char* groupName, const char* groupDesc, const TexFuncCaseSpec* cases, int numCases, bool isVertex)
{
	tcu::TestCaseGroup* group = new tcu::TestCaseGroup(parent->getTestContext(), groupName, groupDesc);
	parent->addChild(group);

	for (int ndx = 0; ndx < numCases; ndx++)
		group->addChild(new ShaderTextureFunctionCase(parent->getContext(), cases[ndx].name, "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, isVertex));
}